

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::SpectrumTextureHandle::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumTextureHandle *this)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  SpectrumPtexTexture *this_00;
  allocator<char> local_9;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          ).bits;
  this_00 = (SpectrumPtexTexture *)(uVar1 & 0xffffffffffff);
  if (this_00 == (SpectrumPtexTexture *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(nullptr)",&local_9);
  }
  else {
    uVar2 = (ushort)(uVar1 >> 0x30);
    uVar3 = (uint)uVar2;
    if ((uint)(uVar1 >> 0x31) < 3) {
      if (uVar3 < 3) {
        if (uVar1 >> 0x31 == 0) {
          SpectrumImageTexture::ToString_abi_cxx11_
                    (__return_storage_ptr__,(SpectrumImageTexture *)this_00);
        }
        else {
          GPUSpectrumImageTexture::ToString_abi_cxx11_
                    (__return_storage_ptr__,(GPUSpectrumImageTexture *)this_00);
        }
      }
      else if ((uVar2 & 6) == 2) {
        SpectrumMixTexture::ToString_abi_cxx11_
                  (__return_storage_ptr__,(SpectrumMixTexture *)this_00);
      }
      else if (uVar3 - 3 < 2) {
        SpectrumScaledTexture::ToString_abi_cxx11_
                  (__return_storage_ptr__,(SpectrumScaledTexture *)this_00);
      }
      else {
        SpectrumConstantTexture::ToString_abi_cxx11_
                  (__return_storage_ptr__,(SpectrumConstantTexture *)this_00);
      }
    }
    else if (uVar2 - 5 < 3) {
      if (uVar2 - 5 == 2) {
        SpectrumCheckerboardTexture::ToString_abi_cxx11_
                  (__return_storage_ptr__,(SpectrumCheckerboardTexture *)this_00);
      }
      else {
        SpectrumBilerpTexture::ToString_abi_cxx11_
                  (__return_storage_ptr__,(SpectrumBilerpTexture *)this_00);
      }
    }
    else if (uVar2 - 7 < 2) {
      MarbleTexture::ToString_abi_cxx11_(__return_storage_ptr__,(MarbleTexture *)this_00);
    }
    else if ((uVar3 & 0xfffffffe) == 8) {
      SpectrumDotsTexture::ToString_abi_cxx11_
                (__return_storage_ptr__,(SpectrumDotsTexture *)this_00);
    }
    else {
      SpectrumPtexTexture::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumTextureHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto toStr = [](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(toStr);
}